

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

void Rnm_ManVerifyUsingTerSim
               (Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vMap,Vec_Int_t *vObjs,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  uint v;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  uVar10 = 0x4000000000000000;
  iVar2 = pCex->nRegs;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  for (iVar8 = 0; iVar8 <= pCex->iFrame; iVar8 = iVar8 + 1) {
    for (iVar9 = 0; iVar9 < vMap->nSize; iVar9 = iVar9 + 1) {
      iVar1 = Vec_IntEntry(vMap,iVar9);
      pGVar3 = Gia_ManObj(p,iVar1);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar3->Value =
           (uint)(((uint)(&pCex[1].iPo)[iVar2 + iVar9 >> 5] >> (iVar2 + iVar9 & 0x1fU) & 1) != 0);
      iVar1 = Gia_ObjIsPi(p,pGVar3);
      if (iVar1 == 0) {
        uVar4 = *(ulong *)pGVar3 | 0x4000000040000000;
      }
      else if (pGVar3->Value == 0) {
        uVar4 = *(ulong *)pGVar3 & 0xbfffffffbfffffff | 0x40000000;
      }
      else {
        uVar4 = *(ulong *)pGVar3 & 0xbfffffffbfffffff | 0x4000000000000000;
      }
      *(ulong *)pGVar3 = uVar4;
    }
    for (iVar9 = 0; iVar9 < vRes->nSize; iVar9 = iVar9 + 1) {
      iVar1 = Vec_IntEntry(vRes,iVar9);
      pGVar3 = Gia_ManObj(p,iVar1);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = uVar10;
      if (pGVar3->Value == 0) {
        uVar4 = 0x40000000;
      }
      *(ulong *)pGVar3 = uVar4 | *(ulong *)pGVar3 & 0xbfffffffbfffffff;
    }
    for (iVar9 = 0; iVar9 < vObjs->nSize; iVar9 = iVar9 + 1) {
      iVar1 = Vec_IntEntry(vObjs,iVar9);
      pGVar3 = Gia_ManObj(p,iVar1);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)pGVar3;
      uVar5 = uVar4 & 0x1fffffff;
      if (uVar5 == 0x1fffffff || -1 < (int)uVar4) {
        if ((int)uVar4 < 0 || (int)uVar5 == 0x1fffffff) {
          if (iVar8 == 0) goto LAB_004ff0c3;
          pGVar7 = Gia_ObjRoToRi(p,pGVar3);
          iVar1 = Gia_ObjIsRo(p,pGVar3);
          if (iVar1 == 0) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x3b4,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          if ((*(ulong *)pGVar7 & 0x4000000040000000) == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x3b5,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar5 = *(ulong *)pGVar7 & 0x40000000;
          uVar4 = *(ulong *)pGVar3;
          *(ulong *)pGVar3 = uVar4 & 0xffffffffbfffffff | uVar5;
          uVar4 = uVar4 & 0xbfffffffbfffffff | uVar5 | *(ulong *)pGVar7 & 0x4000000000000000;
        }
        else {
          if (((undefined1  [12])pGVar3[-uVar5] & (undefined1  [12])0x4000000040000000) ==
              (undefined1  [12])0x0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x39d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
          }
          uVar5 = *(ulong *)(pGVar3 + -(ulong)((uint)(uVar4 >> 0x20) & 0x1fffffff)) &
                  0x4000000040000000;
          if (uVar5 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x39e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
          }
          iVar1 = Gia_ObjTerSimGet0Fanin0(pGVar3);
          if (iVar1 == 0) {
            uVar6 = uVar10;
            if ((uVar4 >> 0x3d & 1) == 0) {
              uVar6 = 0x40000000;
            }
            if (uVar5 != uVar6) {
              iVar1 = Gia_ObjTerSimGet1Fanin0(pGVar3);
              uVar6 = 0x40000000;
              if ((uVar4 >> 0x3d & 1) == 0) {
                uVar6 = uVar10;
              }
              if ((uVar5 == uVar6) && (iVar1 != 0)) {
                uVar4 = uVar4 & 0xbfffffff3fffffff | 0x4000000000000000;
              }
              else {
                uVar4 = uVar4 | 0x4000000040000000;
              }
              goto LAB_004ff0d7;
            }
          }
          uVar4 = uVar4 & 0xbfffffff3fffffff | 0x40000000;
        }
      }
      else {
        if (((undefined1  [12])pGVar3[-uVar5] & (undefined1  [12])0x4000000040000000) ==
            (undefined1  [12])0x0) {
          __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x3a9,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
        }
        iVar1 = Gia_ObjTerSimGet0Fanin0(pGVar3);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjTerSimGet1Fanin0(pGVar3);
          if (iVar1 == 0) {
            uVar4 = uVar4 | 0x4000000040000000;
          }
          else {
            uVar4 = uVar4 & 0xbfffffffbfffffff | 0x4000000000000000;
          }
        }
        else {
LAB_004ff0c3:
          uVar4 = uVar4 & 0xbfffffffbfffffff | 0x40000000;
        }
      }
LAB_004ff0d7:
      *(ulong *)pGVar3 = uVar4;
    }
    iVar2 = iVar2 + pCex->nPis;
  }
  for (iVar2 = 0; iVar8 = (int)pCex, iVar2 < vMap->nSize; iVar2 = iVar2 + 1) {
    v = Vec_IntEntry(vMap,iVar2);
    pCex = (Abc_Cex_t *)(ulong)v;
    pGVar3 = Gia_ManObj(p,v);
    iVar8 = (int)pCex;
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
  }
  pGVar3 = Gia_ManPo(p,iVar8);
  if (((undefined1  [12])*pGVar3 & (undefined1  [12])0x4000000040000000) !=
      (undefined1  [12])0x4000000000000000) {
    Abc_Print((int)p,"\nRefinement verification has failed!!!\n");
    return;
  }
  return;
}

Assistant:

void Rnm_ManVerifyUsingTerSim( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vMap, Vec_Int_t * vObjs, Vec_Int_t * vRes )
{
    Gia_Obj_t * pObj;
    int i, f, iBit = pCex->nRegs;
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    for ( f = 0; f <= pCex->iFrame; f++, iBit += pCex->nPis )
    {
        Gia_ManForEachObjVec( vMap, p, pObj, i )
        {
            pObj->Value = Abc_InfoHasBit( pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p, pObj) )
                Gia_ObjTerSimSetX( pObj );
            else if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vRes, p, pObj, i ) // vRes is subset of vMap
        {
            if ( pObj->Value )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachObjVec( vObjs, p, pObj, i )
        {
            if ( Gia_ObjIsCo(pObj) )
                Gia_ObjTerSimCo( pObj );
            else if ( Gia_ObjIsAnd(pObj) )
                Gia_ObjTerSimAnd( pObj );
            else if ( f == 0 )
                Gia_ObjTerSimSet0( pObj );
            else
                Gia_ObjTerSimRo( p, pObj );
        }
    }
    Gia_ManForEachObjVec( vMap, p, pObj, i )
        pObj->Value = 0;
    pObj = Gia_ManPo( p, 0 );
    if ( !Gia_ObjTerSimGet1(pObj) )
        Abc_Print( 1, "\nRefinement verification has failed!!!\n" );
}